

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O1

LayoutElement * __thiscall
Diligent::DynamicLinearAllocator::ConstructArray<Diligent::LayoutElement>
          (DynamicLinearAllocator *this,size_t count)

{
  LayoutElement *pLVar1;
  Uint32 *pUVar2;
  
  pLVar1 = (LayoutElement *)Allocate(this,count * 0x28,8);
  if (count != 0) {
    pUVar2 = &pLVar1->InstanceDataStepRate;
    do {
      ((LayoutElement *)(pUVar2 + -9))->HLSLSemantic = "ATTRIB";
      *(undefined8 *)(pUVar2 + -7) = 0;
      pUVar2[-5] = 0;
      *(undefined2 *)(pUVar2 + -4) = 0x108;
      *(undefined8 *)(pUVar2 + -3) = 0xffffffffffffffff;
      *(INPUT_ELEMENT_FREQUENCY *)(pUVar2 + -1) = INPUT_ELEMENT_FREQUENCY_PER_VERTEX;
      *pUVar2 = 1;
      pUVar2 = pUVar2 + 10;
      count = count - 1;
    } while (count != 0);
  }
  return pLVar1;
}

Assistant:

NODISCARD T* ConstructArray(size_t count, const Args&... args)
    {
        T* Ptr = Allocate<T>(count);
        for (size_t i = 0; i < count; ++i)
        {
            new (Ptr + i) T{args...};
        }
        return Ptr;
    }